

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O0

void test_normc<wchar_t>(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                         *orig,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *normal,norm_type type)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  ostream *poVar4;
  undefined8 uVar5;
  runtime_error *this;
  int iVar6;
  locale l;
  locale *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  norm_type n;
  string *s;
  runtime_error *in_stack_fffffffffffffe20;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffe28;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  undefined1 local_131 [33];
  wstring local_110 [38];
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  wstring local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  wstring local_80 [55];
  allocator local_49;
  string local_48 [32];
  generator local_28 [8];
  string local_20 [32];
  
  booster::locale::generator::generator(local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"en_US.UTF-8",&local_49);
  booster::locale::generator::generate(local_20);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  booster::locale::generator::~generator(local_28);
  test_counter = test_counter + 1;
  booster::locale::normalize<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (norm_type)((ulong)in_stack_fffffffffffffe30 >> 0x20),
             (locale *)in_stack_fffffffffffffe28);
  _Var2 = std::operator==(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::__cxx11::wstring::~wstring(local_80);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1b);
    poVar4 = std::operator<<(poVar4," normalize(orig,type,l)==normal");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar6 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar1) {
      local_a2 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"Error limits reached, stopping unit test",&local_a1);
      booster::runtime_error::runtime_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_a2 = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  booster::locale::normalize<wchar_t>
            ((wchar_t *)in_stack_fffffffffffffe28,
             (norm_type)((ulong)in_stack_fffffffffffffe20 >> 0x20),
             (locale *)in_stack_fffffffffffffe18);
  _Var2 = std::operator==(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::__cxx11::wstring::~wstring(local_c8);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1c);
    poVar4 = std::operator<<(poVar4," normalize(orig.c_str(),type,l)==normal");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar6 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar1) {
      local_ea = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"Error limits reached, stopping unit test",&local_e9);
      booster::runtime_error::runtime_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_ea = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  n = (norm_type)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  booster::locale::normalize<wchar_t>
            ((wchar_t *)in_stack_fffffffffffffe28,(wchar_t *)in_stack_fffffffffffffe20,n,
             in_stack_fffffffffffffe10);
  bVar3 = std::operator==(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::__cxx11::wstring::~wstring(local_110);
  if ((bVar3 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1d);
    this = (runtime_error *)
           std::operator<<(poVar4," normalize(orig.c_str(),orig.c_str()+orig.size(),type,l)==normal"
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    iVar6 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar1) {
      uVar5 = __cxa_allocate_exception(0x30);
      s = (string *)local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_131 + 1),"Error limits reached, stopping unit test",(allocator *)s
                );
      booster::runtime_error::runtime_error(this,s);
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::~locale((locale *)local_20);
  return;
}

Assistant:

void test_normc(std::basic_string<Char> orig,std::basic_string<Char> normal,booster::locale::norm_type type)
{
    std::locale l = booster::locale::generator().generate("en_US.UTF-8");
    TEST(normalize(orig,type,l)==normal);
    TEST(normalize(orig.c_str(),type,l)==normal);
    TEST(normalize(orig.c_str(),orig.c_str()+orig.size(),type,l)==normal);
}